

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predictor_enc.c
# Opt level: O0

float GetPredictionCostCrossColorBlue
                (uint32_t *argb,int stride,int tile_width,int tile_height,VP8LMultipliers prev_x,
                VP8LMultipliers prev_y,int green_to_blue,int red_to_blue,int *accumulated_blue_histo
                )

{
  int in_ECX;
  int in_EDX;
  int in_ESI;
  uint32_t *in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  float fVar1;
  uint in_stack_00000008;
  float cur_diff;
  int histo [256];
  int *counts;
  undefined4 in_stack_fffffffffffffbd0;
  undefined4 in_stack_fffffffffffffbd4;
  int local_428 [259];
  int local_1c;
  int local_18;
  int local_14;
  uint32_t *local_10;
  undefined2 local_6;
  byte local_4;
  undefined2 local_3;
  byte local_1;
  
  local_3 = (undefined2)in_R8D;
  local_1 = (byte)((uint)in_R8D >> 0x10);
  local_4 = (byte)((uint)in_R9D >> 0x10);
  local_6 = (undefined2)in_R9D;
  local_1c = in_ECX;
  local_18 = in_EDX;
  local_14 = in_ESI;
  local_10 = in_RDI;
  memset(local_428,0,0x400);
  counts = local_428;
  (*VP8LCollectColorBlueTransforms)
            (local_10,local_14,local_18,local_1c,in_stack_00000008,histo[0],counts);
  fVar1 = PredictionCostCrossColor
                    ((int *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),counts);
  if ((in_stack_00000008 & 0xff) == (uint)local_3._1_1_) {
    fVar1 = fVar1 - 3.0;
  }
  if ((in_stack_00000008 & 0xff) == (uint)local_6._1_1_) {
    fVar1 = fVar1 - 3.0;
  }
  if ((histo[0] & 0xffU) == (uint)local_1) {
    fVar1 = fVar1 - 3.0;
  }
  if ((histo[0] & 0xffU) == (uint)local_4) {
    fVar1 = fVar1 - 3.0;
  }
  if (in_stack_00000008 == 0) {
    fVar1 = fVar1 - 3.0;
  }
  if (histo[0] == 0) {
    fVar1 = fVar1 - 3.0;
  }
  return fVar1;
}

Assistant:

static float GetPredictionCostCrossColorBlue(
    const uint32_t* argb, int stride, int tile_width, int tile_height,
    VP8LMultipliers prev_x, VP8LMultipliers prev_y,
    int green_to_blue, int red_to_blue, const int accumulated_blue_histo[256]) {
  int histo[256] = { 0 };
  float cur_diff;

  VP8LCollectColorBlueTransforms(argb, stride, tile_width, tile_height,
                                 green_to_blue, red_to_blue, histo);

  cur_diff = PredictionCostCrossColor(accumulated_blue_histo, histo);
  if ((uint8_t)green_to_blue == prev_x.green_to_blue_) {
    cur_diff -= 3;  // favor keeping the areas locally similar
  }
  if ((uint8_t)green_to_blue == prev_y.green_to_blue_) {
    cur_diff -= 3;  // favor keeping the areas locally similar
  }
  if ((uint8_t)red_to_blue == prev_x.red_to_blue_) {
    cur_diff -= 3;  // favor keeping the areas locally similar
  }
  if ((uint8_t)red_to_blue == prev_y.red_to_blue_) {
    cur_diff -= 3;  // favor keeping the areas locally similar
  }
  if (green_to_blue == 0) {
    cur_diff -= 3;
  }
  if (red_to_blue == 0) {
    cur_diff -= 3;
  }
  return cur_diff;
}